

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O0

void __thiscall WorkerThread::workerFunction(WorkerThread *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  Task localTask;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  condition_variable *in_stack_ffffffffffffffc8;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffd0;
  
  std::packaged_task<void_()>::packaged_task((packaged_task<void_()> *)0x119e8c);
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffffc8),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffc0,(mutex_type *)in_RDI);
    in_stack_ffffffffffffffc0 = in_RDI;
    std::condition_variable::wait<WorkerThread::workerFunction()::__0>
              (in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffd0);
    std::packaged_task<void_()>::operator=
              ((packaged_task<void_()> *)in_stack_ffffffffffffffd0.this,
               (packaged_task<void_()> *)in_stack_ffffffffffffffc8);
    in_RDI[1]._M_owns = false;
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffc0);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      std::packaged_task<void_()>::operator()((packaged_task<void_()> *)in_stack_ffffffffffffffc0);
    }
  }
  std::packaged_task<void_()>::~packaged_task
            ((packaged_task<void_()> *)in_stack_ffffffffffffffd0.this);
  return;
}

Assistant:

void WorkerThread::workerFunction () {
	Task localTask;

	while (!stopMe) {
		{
			std::unique_lock<std::mutex> lock (taskMutex);
			taskCV.wait (lock, [&] {return taskPresence==true || stopMe;});
			localTask		= std::move(task);
			taskPresence	= false;
		}

		if (!stopMe) {
			// Executing submitted activity
			localTask ();
		}
	}
}